

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::IfdefGuardPrinter::~IfdefGuardPrinter(IfdefGuardPrinter *this)

{
  Printer *this_00;
  Arg *in_R8;
  string_view text;
  string_view format;
  string local_60;
  size_type local_40;
  pointer local_38;
  
  this_00 = this->p_;
  local_38 = (this->ifdef_identifier_)._M_dataplus._M_p;
  local_40 = (this->ifdef_identifier_)._M_string_length;
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"\n#endif  // $0\n";
  absl::lts_20240722::Substitute_abi_cxx11_(&local_60,(lts_20240722 *)0xf,format,in_R8);
  text._M_str = local_60._M_dataplus._M_p;
  text._M_len = local_60._M_string_length;
  io::Printer::Print<>(this_00,text);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&this->ifdef_identifier_);
  return;
}

Assistant:

IfdefGuardPrinter::~IfdefGuardPrinter() {
  // We can't use variable substitution, because we don't know what delimiter
  // to use.
  p_->Print(absl::Substitute(
      R"(
#endif  // $0
)",
      ifdef_identifier_));
}